

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_643cf::ArchiveShellCommand::executeExternalCommand
          (ArchiveShellCommand *this,BuildSystem *param_1,TaskInterface ti,QueueJobContext *context,
          Optional<std::function<void_(llbuild::basic::ProcessResult)>_> *completionFn)

{
  ProcessAttributes attributes;
  undefined1 auVar1 [24];
  pointer pSVar2;
  int iVar3;
  _Any_data *p_Var4;
  OptionalStorage<std::function<void_(llbuild::basic::ProcessResult)>,_false> *this_00;
  long lVar5;
  ArrayRef<llvm::StringRef> commandLine;
  Child local_100;
  undefined4 local_f8;
  undefined8 local_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  TaskInterface ti_local;
  undefined6 uStack_c6;
  undefined6 uStack_ae;
  _Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_> local_a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  _Any_data local_78;
  code *local_68;
  code *local_60;
  OptionalStorage<std::function<void_(llbuild::basic::ProcessResult)>,_false> local_58;
  
  ti_local.ctx = ti.ctx;
  ti_local.impl = ti.impl;
  llvm::Twine::Twine((Twine *)&local_100,&this->archiveName);
  iVar3 = llvm::sys::fs::remove((fs *)&local_100.character,(char *)0x1);
  if (iVar3 == 0) {
    (anonymous_namespace)::ArchiveShellCommand::getArgs_abi_cxx11_(&args,this);
    local_a8._M_impl.super__Vector_impl_data._M_start = (StringRef *)0x0;
    local_a8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_a8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<llvm::StringRef,std::allocator<llvm::StringRef>>::
    _M_range_initialize<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              ((vector<llvm::StringRef,std::allocator<llvm::StringRef>> *)&local_a8,
               args.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               args.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    pSVar2 = local_a8._M_impl.super__Vector_impl_data._M_start;
    lVar5 = (long)local_a8._M_impl.super__Vector_impl_data._M_finish -
            (long)local_a8._M_impl.super__Vector_impl_data._M_start;
    llvm::optional_detail::
    OptionalStorage<std::function<void_(llbuild::basic::ProcessResult)>,_false>::OptionalStorage
              ((OptionalStorage<std::function<void_(llbuild::basic::ProcessResult)>,_false> *)
               &local_100,&completionFn->Storage);
    local_78._8_8_ = 0;
    this_00 = (OptionalStorage<std::function<void_(llbuild::basic::ProcessResult)>,_false> *)
              operator_new(0x28);
    llvm::optional_detail::
    OptionalStorage<std::function<void_(llbuild::basic::ProcessResult)>,_false>::OptionalStorage
              (this_00,(OptionalStorage<std::function<void_(llbuild::basic::ProcessResult)>,_false>
                        *)&local_100);
    local_60 = std::
               _Function_handler<void_(llbuild::basic::ProcessResult),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:3488:15)>
               ::_M_invoke;
    local_68 = std::
               _Function_handler<void_(llbuild::basic::ProcessResult),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:3488:15)>
               ::_M_manager;
    local_78._M_unused._M_object = this_00;
    llvm::optional_detail::
    OptionalStorage<std::function<void_(llbuild::basic::ProcessResult)>,_false>::OptionalStorage
              (&local_58,(function<void_(llbuild::basic::ProcessResult)> *)&local_78);
    attributes._26_6_ = uStack_ae;
    attributes.inheritEnvironment = true;
    attributes.controlEnabled = true;
    auVar1 = ZEXT824(CONCAT62(uStack_c6,1));
    attributes.canSafelyInterrupt = (bool)auVar1[0];
    attributes.connectToConsole = (bool)auVar1[1];
    attributes._2_6_ = auVar1._2_6_;
    attributes.workingDir.Data = (char *)SUB168(auVar1._8_16_,0);
    attributes.workingDir.Length = SUB168(auVar1._8_16_,8);
    commandLine.Length = lVar5 >> 4;
    commandLine.Data = pSVar2;
    llbuild::core::TaskInterface::spawn
              (&ti_local,context,commandLine,
               (ArrayRef<std::pair<llvm::StringRef,_llvm::StringRef>_>)ZEXT816(0),attributes,
               (Optional<std::function<void_(llbuild::basic::ProcessResult)>_> *)&local_58,
               (ProcessDelegate *)0x0);
    llvm::optional_detail::
    OptionalStorage<std::function<void_(llbuild::basic::ProcessResult)>,_false>::reset(&local_58);
    if (local_68 != (code *)0x0) {
      (*local_68)(&local_78,&local_78,__destroy_functor);
    }
    llvm::optional_detail::
    OptionalStorage<std::function<void_(llbuild::basic::ProcessResult)>,_false>::reset
              ((OptionalStorage<std::function<void_(llbuild::basic::ProcessResult)>,_false> *)
               &local_100);
    std::_Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>::~_Vector_base(&local_a8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&args);
  }
  else if ((completionFn->Storage).hasVal == true) {
    p_Var4 = (_Any_data *)
             llvm::Optional<std::function<void_(llbuild::basic::ProcessResult)>_>::getPointer
                       (completionFn);
    local_100 = (Child)0xffffffff00000001;
    local_f8 = 0xffffffff;
    local_e0 = 0;
    local_f0 = 0;
    uStack_e8 = 0;
    if (*(long *)(p_Var4 + 1) == 0) {
      std::__throw_bad_function_call();
    }
    (**(code **)(p_Var4->_M_pod_data + 0x18))(p_Var4,(ProcessResult *)&local_100);
  }
  return;
}

Assistant:

virtual void executeExternalCommand(
      BuildSystem&,
      TaskInterface ti,
      QueueJobContext* context,
      llvm::Optional<ProcessCompletionFn> completionFn) override {
    // First delete the current archive
    // TODO instead insert, update and remove files from the archive
    if (llvm::sys::fs::remove(archiveName, /*IgnoreNonExisting*/ true)) {
      if (completionFn.hasValue())
        completionFn.getValue()(ProcessStatus::Failed);
      return;
    }

    // Create archive
    auto args = getArgs();
    ti.spawn(context,
             std::vector<StringRef>(args.begin(), args.end()),
             {}, {true},
             {[completionFn](ProcessResult result) {
      if (completionFn.hasValue())
        completionFn.getValue()(result);
    }});
  }